

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyBlobAppend(SyBlob *pBlob,void *pData,sxu32 nSize)

{
  uint uVar1;
  sxu32 sVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  
  if (nSize == 0) {
    return 0;
  }
  if ((pBlob->nFlags & 3) != 0) {
    uVar1 = pBlob->mByte - pBlob->nByte;
    iVar4 = 0;
    if ((uVar1 < nSize) && (iVar4 = -0x1d, nSize = uVar1, pBlob->mByte != pBlob->nByte)) {
      iVar4 = 0;
    }
    goto LAB_001114b5;
  }
  if ((pBlob->nFlags & 4) == 0) {
LAB_00111466:
    sVar2 = pBlob->mByte;
    iVar4 = 0;
    if (nSize <= sVar2 - pBlob->nByte) goto LAB_001114b5;
    if (sVar2 == 0) {
      sVar2 = 0x10;
      if (0x10 < nSize) {
        sVar2 = nSize;
      }
    }
    else {
      sVar2 = nSize + sVar2 * 2 + 0x10;
    }
    pvVar3 = SyMemBackendRealloc(pBlob->pAllocator,pBlob->pBlob,sVar2);
    if (pvVar3 != (void *)0x0) {
      pBlob->pBlob = pvVar3;
      pBlob->mByte = sVar2;
      goto LAB_001114b5;
    }
  }
  else {
    if (pBlob->nByte == 0) {
      pBlob->pBlob = (void *)0x0;
      sVar2 = 0;
LAB_0011145d:
      pBlob->mByte = sVar2;
      *(byte *)&pBlob->nFlags = (byte)pBlob->nFlags & 0xfb;
      goto LAB_00111466;
    }
    pvVar3 = SyMemBackendDup(pBlob->pAllocator,pBlob->pBlob,pBlob->nByte);
    if (pvVar3 != (void *)0x0) {
      pBlob->pBlob = pvVar3;
      sVar2 = pBlob->nByte;
      goto LAB_0011145d;
    }
  }
  iVar4 = -1;
LAB_001114b5:
  if (iVar4 != 0) {
    return iVar4;
  }
  if (pData == (void *)0x0) {
    return 0;
  }
  pvVar3 = pBlob->pBlob;
  uVar1 = pBlob->nByte;
  pBlob->nByte = uVar1 + nSize;
  if (nSize == 0) {
    return 0;
  }
  lVar5 = 0;
  do {
    *(undefined1 *)((long)pvVar3 + lVar5 + (ulong)uVar1) = *(undefined1 *)((long)pData + lVar5);
    iVar4 = (int)lVar5;
    if (nSize - 1 == iVar4) {
      return 0;
    }
    *(undefined1 *)((long)pvVar3 + lVar5 + (ulong)uVar1 + 1) =
         *(undefined1 *)((long)pData + lVar5 + 1);
    if (nSize - 2 == iVar4) {
      return 0;
    }
    *(undefined1 *)((long)pvVar3 + lVar5 + (ulong)uVar1 + 2) =
         *(undefined1 *)((long)pData + lVar5 + 2);
    if (nSize - 3 == iVar4) {
      return 0;
    }
    *(undefined1 *)((long)pvVar3 + lVar5 + (ulong)uVar1 + 3) =
         *(undefined1 *)((long)pData + lVar5 + 3);
    lVar5 = lVar5 + 4;
  } while (nSize != (uint)lVar5);
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobAppend(SyBlob *pBlob, const void *pData, sxu32 nSize)
{
	sxu8 *zBlob;
	sxi32 rc;
	if( nSize < 1 ){
		return SXRET_OK;
	}
	rc = BlobPrepareGrow(&(*pBlob), &nSize);
	if( SXRET_OK != rc ){
		return rc;
	}
	if( pData ){
		zBlob = (sxu8 *)pBlob->pBlob ;
		zBlob = &zBlob[pBlob->nByte];
		pBlob->nByte += nSize;
		SX_MACRO_FAST_MEMCPY(pData, zBlob, nSize);
	}
	return SXRET_OK;
}